

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O0

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPreviewSurface>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPreviewSurface *surface,string *warn,string *err,PrimReconstructOptions *options)

{
  bool bVar1;
  Property *pPVar2;
  size_type sVar3;
  mapped_type *this;
  ostream *poVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_29b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2990 [32];
  string local_2970 [32];
  ostringstream local_2950 [8];
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_27c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_27a8 [39];
  allocator local_2781;
  string local_2780 [32];
  string local_2760;
  ostringstream local_2740 [8];
  ostringstream ss_e_15;
  allocator local_25c1;
  string local_25c0;
  string local_25a0;
  undefined1 local_2580 [8];
  ParseResult ret_15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2538 [39];
  allocator local_2511;
  string local_2510 [32];
  string local_24f0;
  ostringstream local_24d0 [8];
  ostringstream ss_e_14;
  allocator local_2351;
  string local_2350;
  string local_2330;
  undefined1 local_2310 [8];
  ParseResult ret_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22c8 [39];
  allocator local_22a1;
  string local_22a0 [32];
  string local_2280;
  ostringstream local_2260 [8];
  ostringstream ss_e_13;
  allocator local_20e1;
  string local_20e0;
  string local_20c0;
  undefined1 local_20a0 [8];
  ParseResult ret_13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2058 [39];
  allocator local_2031;
  string local_2030 [32];
  string local_2010;
  ostringstream local_1ff0 [8];
  ostringstream ss_e_12;
  allocator local_1e71;
  string local_1e70;
  string local_1e50;
  undefined1 local_1e30 [8];
  ParseResult ret_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1de8 [39];
  allocator local_1dc1;
  string local_1dc0 [32];
  string local_1da0;
  ostringstream local_1d80 [8];
  ostringstream ss_e_11;
  allocator local_1c01;
  string local_1c00;
  string local_1be0;
  undefined1 local_1bc0 [8];
  ParseResult ret_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b78 [39];
  allocator local_1b51;
  string local_1b50 [32];
  string local_1b30;
  ostringstream local_1b10 [8];
  ostringstream ss_e_10;
  allocator local_1991;
  string local_1990;
  string local_1970;
  undefined1 local_1950 [8];
  ParseResult ret_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1908 [39];
  allocator local_18e1;
  string local_18e0 [32];
  string local_18c0;
  ostringstream local_18a0 [8];
  ostringstream ss_e_9;
  allocator local_1721;
  string local_1720;
  string local_1700;
  undefined1 local_16e0 [8];
  ParseResult ret_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1698 [39];
  allocator local_1671;
  string local_1670 [32];
  string local_1650;
  ostringstream local_1630 [8];
  ostringstream ss_e_8;
  allocator local_14b1;
  string local_14b0;
  string local_1490;
  undefined1 local_1470 [8];
  ParseResult ret_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1428 [39];
  allocator local_1401;
  string local_1400 [32];
  string local_13e0;
  ostringstream local_13c0 [8];
  ostringstream ss_e_7;
  allocator local_1241;
  string local_1240;
  string local_1220;
  undefined1 local_1200 [8];
  ParseResult ret_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b8 [39];
  allocator local_1191;
  string local_1190 [32];
  string local_1170;
  ostringstream local_1150 [8];
  ostringstream ss_e_6;
  allocator local_fd1;
  string local_fd0;
  string local_fb0;
  undefined1 local_f90 [8];
  ParseResult ret_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f48 [39];
  allocator local_f21;
  string local_f20 [32];
  string local_f00;
  ostringstream local_ee0 [8];
  ostringstream ss_e_5;
  allocator local_d61;
  string local_d60;
  string local_d40;
  undefined1 local_d20 [8];
  ParseResult ret_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cd8 [39];
  allocator local_cb1;
  string local_cb0 [32];
  string local_c90;
  ostringstream local_c70 [8];
  ostringstream ss_e_4;
  allocator local_af1;
  string local_af0;
  string local_ad0;
  undefined1 local_ab0 [8];
  ParseResult ret_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68 [39];
  allocator local_a41;
  string local_a40 [32];
  string local_a20;
  ostringstream local_a00 [8];
  ostringstream ss_e_3;
  allocator local_881;
  string local_880;
  string local_860;
  undefined1 local_840 [8];
  ParseResult ret_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8 [39];
  allocator local_7d1;
  string local_7d0 [32];
  string local_7b0;
  ostringstream local_790 [8];
  ostringstream ss_e_2;
  allocator local_611;
  string local_610;
  string local_5f0;
  undefined1 local_5d0 [8];
  ParseResult ret_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588 [39];
  allocator local_561;
  string local_560 [32];
  string local_540;
  ostringstream local_520 [8];
  ostringstream ss_e_1;
  allocator local_3a1;
  string local_3a0;
  string local_380;
  undefined1 local_360 [8];
  ParseResult ret_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318 [39];
  allocator local_2f1;
  string local_2f0 [32];
  string local_2d0;
  ostringstream local_2b0 [8];
  ostringstream ss_e;
  int local_138;
  allocator local_131;
  string local_130;
  string local_110;
  undefined1 local_f0 [8];
  ParseResult ret;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
  *prop;
  const_iterator __end2;
  const_iterator __begin2;
  PropertyMap *__range2;
  allocator local_91;
  value_type local_90 [4];
  undefined1 local_70 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  string *err_local;
  string *warn_local;
  UsdPreviewSurface *surface_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  
  table._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)err;
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_70);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_90,"info:id",&local_91);
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_70,local_90);
  ::std::__cxx11::string::~string((string *)local_90);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_91);
  __end2 = ::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::begin(properties);
  prop = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_conflict
          *)::std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::end(properties);
  while (bVar1 = ::std::operator!=(&__end2,(_Self *)&prop), bVar1) {
    ret.err.field_2._8_8_ =
         ::std::
         _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
         ::operator*(&__end2);
    ::std::__cxx11::string::string((string *)&local_110,(string *)ret.err.field_2._8_8_);
    pPVar2 = (Property *)(ret.err.field_2._8_8_ + 0x20);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_130,"inputs:diffuseColor",&local_131);
    psVar5 = &local_130;
    anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
              ((ParseResult *)local_f0,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_70,&local_110,pPVar2,psVar5,&surface->diffuseColor);
    ::std::__cxx11::string::~string((string *)&local_130);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_131);
    ::std::__cxx11::string::~string((string *)&local_110);
    if ((local_f0._0_4_ == Success) || (local_f0._0_4_ == AlreadyProcessed)) {
      local_138 = 3;
    }
    else if (local_f0._0_4_ == Unmatched) {
      local_138 = 0;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_2b0);
      poVar4 = ::std::operator<<((ostream *)local_2b0,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"ReconstructShader");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xf98);
      ::std::operator<<(poVar4," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_2f0,"Parsing attribute `{}` failed. Error: {}",&local_2f1);
      fmt::format<char[20],std::__cxx11::string>
                (&local_2d0,(fmt *)local_2f0,(string *)"inputs:diffuseColor",(char (*) [20])&ret,
                 psVar5);
      poVar4 = ::std::operator<<((ostream *)local_2b0,(string *)&local_2d0);
      ::std::operator<<(poVar4,"\n");
      ::std::__cxx11::string::~string((string *)&local_2d0);
      ::std::__cxx11::string::~string(local_2f0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
      if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        ::std::__cxx11::ostringstream::str();
        ::std::operator+(local_318,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (ret_1.err.field_2._M_local_buf + 8));
        ::std::__cxx11::string::operator=
                  ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (string *)local_318);
        ::std::__cxx11::string::~string((string *)local_318);
        ::std::__cxx11::string::~string((string *)(ret_1.err.field_2._M_local_buf + 8));
      }
      spec_local._7_1_ = 0;
      local_138 = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_2b0);
    }
    anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_f0);
    if (local_138 == 0) {
      ::std::__cxx11::string::string((string *)&local_380,(string *)ret.err.field_2._8_8_);
      pPVar2 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_3a0,"inputs:emissiveColor",&local_3a1);
      psVar5 = &local_3a0;
      anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
                ((ParseResult *)local_360,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_380,pPVar2,psVar5,&surface->emissiveColor);
      ::std::__cxx11::string::~string((string *)&local_3a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
      ::std::__cxx11::string::~string((string *)&local_380);
      if ((local_360._0_4_ == Success) || (local_360._0_4_ == AlreadyProcessed)) {
        local_138 = 3;
      }
      else if (local_360._0_4_ == Unmatched) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_520);
        poVar4 = ::std::operator<<((ostream *)local_520,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructShader");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xf9a);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_560,"Parsing attribute `{}` failed. Error: {}",&local_561);
        fmt::format<char[21],std::__cxx11::string>
                  (&local_540,(fmt *)local_560,(string *)"inputs:emissiveColor",
                   (char (*) [21])&ret_1,psVar5);
        poVar4 = ::std::operator<<((ostream *)local_520,(string *)&local_540);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)&local_540);
        ::std::__cxx11::string::~string(local_560);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_561);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_588,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_2.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_588);
          ::std::__cxx11::string::~string((string *)local_588);
          ::std::__cxx11::string::~string((string *)(ret_2.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_520);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_360);
      if (local_138 != 0) goto joined_r0x002d2910;
      ::std::__cxx11::string::string((string *)&local_5f0,(string *)ret.err.field_2._8_8_);
      pPVar2 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_610,"inputs:roughness",&local_611);
      psVar5 = &local_610;
      anon_unknown_0::ParseTypedAttribute<float>
                ((ParseResult *)local_5d0,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_5f0,pPVar2,psVar5,&surface->roughness);
      ::std::__cxx11::string::~string((string *)&local_610);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_611);
      ::std::__cxx11::string::~string((string *)&local_5f0);
      if ((local_5d0._0_4_ == Success) || (local_5d0._0_4_ == AlreadyProcessed)) {
        local_138 = 3;
      }
      else if (local_5d0._0_4_ == Unmatched) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_790);
        poVar4 = ::std::operator<<((ostream *)local_790,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructShader");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xf9c);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_7d0,"Parsing attribute `{}` failed. Error: {}",&local_7d1);
        fmt::format<char[17],std::__cxx11::string>
                  (&local_7b0,(fmt *)local_7d0,(string *)"inputs:roughness",(char (*) [17])&ret_2,
                   psVar5);
        poVar4 = ::std::operator<<((ostream *)local_790,(string *)&local_7b0);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)&local_7b0);
        ::std::__cxx11::string::~string(local_7d0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_7f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_3.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_7f8);
          ::std::__cxx11::string::~string((string *)local_7f8);
          ::std::__cxx11::string::~string((string *)(ret_3.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_790);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_5d0);
      if (local_138 != 0) goto joined_r0x002d2910;
      ::std::__cxx11::string::string((string *)&local_860,(string *)ret.err.field_2._8_8_);
      pPVar2 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_880,"inputs:specularColor",&local_881);
      psVar5 = &local_880;
      anon_unknown_0::ParseTypedAttribute<tinyusdz::value::color3f>
                ((ParseResult *)local_840,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_860,pPVar2,psVar5,&surface->specularColor);
      ::std::__cxx11::string::~string((string *)&local_880);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_881);
      ::std::__cxx11::string::~string((string *)&local_860);
      if ((local_840._0_4_ == Success) || (local_840._0_4_ == AlreadyProcessed)) {
        local_138 = 3;
      }
      else if (local_840._0_4_ == Unmatched) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_a00);
        poVar4 = ::std::operator<<((ostream *)local_a00,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructShader");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xf9e);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_a40,"Parsing attribute `{}` failed. Error: {}",&local_a41);
        fmt::format<char[21],std::__cxx11::string>
                  (&local_a20,(fmt *)local_a40,(string *)"inputs:specularColor",
                   (char (*) [21])&ret_3,psVar5);
        poVar4 = ::std::operator<<((ostream *)local_a00,(string *)&local_a20);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)&local_a20);
        ::std::__cxx11::string::~string(local_a40);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_a41);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_a68,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_4.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_a68);
          ::std::__cxx11::string::~string((string *)local_a68);
          ::std::__cxx11::string::~string((string *)(ret_4.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_a00);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_840);
      if (local_138 != 0) goto joined_r0x002d2910;
      ::std::__cxx11::string::string((string *)&local_ad0,(string *)ret.err.field_2._8_8_);
      pPVar2 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_af0,"inputs:metallic",&local_af1);
      psVar5 = &local_af0;
      anon_unknown_0::ParseTypedAttribute<float>
                ((ParseResult *)local_ab0,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_ad0,pPVar2,psVar5,&surface->metallic);
      ::std::__cxx11::string::~string((string *)&local_af0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_af1);
      ::std::__cxx11::string::~string((string *)&local_ad0);
      if ((local_ab0._0_4_ == Success) || (local_ab0._0_4_ == AlreadyProcessed)) {
        local_138 = 3;
      }
      else if (local_ab0._0_4_ == Unmatched) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_c70);
        poVar4 = ::std::operator<<((ostream *)local_c70,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructShader");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,4000);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_cb0,"Parsing attribute `{}` failed. Error: {}",&local_cb1);
        fmt::format<char[16],std::__cxx11::string>
                  (&local_c90,(fmt *)local_cb0,(string *)"inputs:metallic",(char (*) [16])&ret_4,
                   psVar5);
        poVar4 = ::std::operator<<((ostream *)local_c70,(string *)&local_c90);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)&local_c90);
        ::std::__cxx11::string::~string(local_cb0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_cb1);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_cd8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_5.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_cd8);
          ::std::__cxx11::string::~string((string *)local_cd8);
          ::std::__cxx11::string::~string((string *)(ret_5.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_c70);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_ab0);
      if (local_138 != 0) goto joined_r0x002d2910;
      ::std::__cxx11::string::string((string *)&local_d40,(string *)ret.err.field_2._8_8_);
      pPVar2 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_d60,"inputs:clearcoat",&local_d61);
      psVar5 = &local_d60;
      anon_unknown_0::ParseTypedAttribute<float>
                ((ParseResult *)local_d20,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_d40,pPVar2,psVar5,&surface->clearcoat);
      ::std::__cxx11::string::~string((string *)&local_d60);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_d61);
      ::std::__cxx11::string::~string((string *)&local_d40);
      if ((local_d20._0_4_ == Success) || (local_d20._0_4_ == AlreadyProcessed)) {
        local_138 = 3;
      }
      else if (local_d20._0_4_ == Unmatched) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_ee0);
        poVar4 = ::std::operator<<((ostream *)local_ee0,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructShader");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xfa2);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_f20,"Parsing attribute `{}` failed. Error: {}",&local_f21);
        fmt::format<char[17],std::__cxx11::string>
                  (&local_f00,(fmt *)local_f20,(string *)"inputs:clearcoat",(char (*) [17])&ret_5,
                   psVar5);
        poVar4 = ::std::operator<<((ostream *)local_ee0,(string *)&local_f00);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)&local_f00);
        ::std::__cxx11::string::~string(local_f20);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_f21);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_f48,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_6.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_f48);
          ::std::__cxx11::string::~string((string *)local_f48);
          ::std::__cxx11::string::~string((string *)(ret_6.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_ee0);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_d20);
      if (local_138 != 0) goto joined_r0x002d2910;
      ::std::__cxx11::string::string((string *)&local_fb0,(string *)ret.err.field_2._8_8_);
      pPVar2 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_fd0,"inputs:clearcoatRoughness",&local_fd1);
      psVar5 = &local_fd0;
      anon_unknown_0::ParseTypedAttribute<float>
                ((ParseResult *)local_f90,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_fb0,pPVar2,psVar5,&surface->clearcoatRoughness);
      ::std::__cxx11::string::~string((string *)&local_fd0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fd1);
      ::std::__cxx11::string::~string((string *)&local_fb0);
      if ((local_f90._0_4_ == Success) || (local_f90._0_4_ == AlreadyProcessed)) {
        local_138 = 3;
      }
      else if (local_f90._0_4_ == Unmatched) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1150);
        poVar4 = ::std::operator<<((ostream *)local_1150,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructShader");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xfa4);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1190,"Parsing attribute `{}` failed. Error: {}",&local_1191);
        fmt::format<char[26],std::__cxx11::string>
                  (&local_1170,(fmt *)local_1190,(string *)"inputs:clearcoatRoughness",
                   (char (*) [26])&ret_6,psVar5);
        poVar4 = ::std::operator<<((ostream *)local_1150,(string *)&local_1170);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)&local_1170);
        ::std::__cxx11::string::~string(local_1190);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1191);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_11b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_7.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_11b8);
          ::std::__cxx11::string::~string((string *)local_11b8);
          ::std::__cxx11::string::~string((string *)(ret_7.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_1150);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_f90);
      if (local_138 != 0) goto joined_r0x002d2910;
      ::std::__cxx11::string::string((string *)&local_1220,(string *)ret.err.field_2._8_8_);
      pPVar2 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_1240,"inputs:opacity",&local_1241);
      psVar5 = &local_1240;
      anon_unknown_0::ParseTypedAttribute<float>
                ((ParseResult *)local_1200,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_1220,pPVar2,psVar5,&surface->opacity);
      ::std::__cxx11::string::~string((string *)&local_1240);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1241);
      ::std::__cxx11::string::~string((string *)&local_1220);
      if ((local_1200._0_4_ == Success) || (local_1200._0_4_ == AlreadyProcessed)) {
        local_138 = 3;
      }
      else if (local_1200._0_4_ == Unmatched) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_13c0);
        poVar4 = ::std::operator<<((ostream *)local_13c0,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructShader");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xfa6);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1400,"Parsing attribute `{}` failed. Error: {}",&local_1401);
        fmt::format<char[15],std::__cxx11::string>
                  (&local_13e0,(fmt *)local_1400,(string *)"inputs:opacity",(char (*) [15])&ret_7,
                   psVar5);
        poVar4 = ::std::operator<<((ostream *)local_13c0,(string *)&local_13e0);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)&local_13e0);
        ::std::__cxx11::string::~string(local_1400);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1401);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_1428,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_8.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_1428);
          ::std::__cxx11::string::~string((string *)local_1428);
          ::std::__cxx11::string::~string((string *)(ret_8.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_13c0);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_1200);
      if (local_138 != 0) goto joined_r0x002d2910;
      ::std::__cxx11::string::string((string *)&local_1490,(string *)ret.err.field_2._8_8_);
      pPVar2 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_14b0,"inputs:opacityThreshold",&local_14b1);
      psVar5 = &local_14b0;
      anon_unknown_0::ParseTypedAttribute<float>
                ((ParseResult *)local_1470,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_1490,pPVar2,psVar5,&surface->opacityThreshold);
      ::std::__cxx11::string::~string((string *)&local_14b0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_14b1);
      ::std::__cxx11::string::~string((string *)&local_1490);
      if ((local_1470._0_4_ == Success) || (local_1470._0_4_ == AlreadyProcessed)) {
        local_138 = 3;
      }
      else if (local_1470._0_4_ == Unmatched) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1630);
        poVar4 = ::std::operator<<((ostream *)local_1630,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructShader");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xfa8);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1670,"Parsing attribute `{}` failed. Error: {}",&local_1671);
        fmt::format<char[24],std::__cxx11::string>
                  (&local_1650,(fmt *)local_1670,(string *)"inputs:opacityThreshold",
                   (char (*) [24])&ret_8,psVar5);
        poVar4 = ::std::operator<<((ostream *)local_1630,(string *)&local_1650);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)&local_1650);
        ::std::__cxx11::string::~string(local_1670);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1671);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_1698,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_9.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_1698);
          ::std::__cxx11::string::~string((string *)local_1698);
          ::std::__cxx11::string::~string((string *)(ret_9.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_1630);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_1470);
      if (local_138 != 0) goto joined_r0x002d2910;
      ::std::__cxx11::string::string((string *)&local_1700,(string *)ret.err.field_2._8_8_);
      pPVar2 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_1720,"inputs:ior",&local_1721);
      psVar5 = &local_1720;
      anon_unknown_0::ParseTypedAttribute<float>
                ((ParseResult *)local_16e0,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_1700,pPVar2,psVar5,&surface->ior);
      ::std::__cxx11::string::~string((string *)&local_1720);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1721);
      ::std::__cxx11::string::~string((string *)&local_1700);
      if ((local_16e0._0_4_ == Success) || (local_16e0._0_4_ == AlreadyProcessed)) {
        local_138 = 3;
      }
      else if (local_16e0._0_4_ == Unmatched) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_18a0);
        poVar4 = ::std::operator<<((ostream *)local_18a0,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructShader");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xfaa);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_18e0,"Parsing attribute `{}` failed. Error: {}",&local_18e1);
        fmt::format<char[11],std::__cxx11::string>
                  (&local_18c0,(fmt *)local_18e0,(string *)"inputs:ior",(char (*) [11])&ret_9,psVar5
                  );
        poVar4 = ::std::operator<<((ostream *)local_18a0,(string *)&local_18c0);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)&local_18c0);
        ::std::__cxx11::string::~string(local_18e0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_18e1);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_1908,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_10.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_1908);
          ::std::__cxx11::string::~string((string *)local_1908);
          ::std::__cxx11::string::~string((string *)(ret_10.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_18a0);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_16e0);
      if (local_138 != 0) goto joined_r0x002d2910;
      ::std::__cxx11::string::string((string *)&local_1970,(string *)ret.err.field_2._8_8_);
      pPVar2 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_1990,"inputs:normal",&local_1991);
      psVar5 = &local_1990;
      anon_unknown_0::ParseTypedAttribute<tinyusdz::value::normal3f>
                ((ParseResult *)local_1950,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_1970,pPVar2,psVar5,&surface->normal);
      ::std::__cxx11::string::~string((string *)&local_1990);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1991);
      ::std::__cxx11::string::~string((string *)&local_1970);
      if ((local_1950._0_4_ == Success) || (local_1950._0_4_ == AlreadyProcessed)) {
        local_138 = 3;
      }
      else if (local_1950._0_4_ == Unmatched) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1b10);
        poVar4 = ::std::operator<<((ostream *)local_1b10,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructShader");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xfac);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1b50,"Parsing attribute `{}` failed. Error: {}",&local_1b51);
        fmt::format<char[14],std::__cxx11::string>
                  (&local_1b30,(fmt *)local_1b50,(string *)"inputs:normal",(char (*) [14])&ret_10,
                   psVar5);
        poVar4 = ::std::operator<<((ostream *)local_1b10,(string *)&local_1b30);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)&local_1b30);
        ::std::__cxx11::string::~string(local_1b50);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1b51);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_1b78,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_11.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_1b78);
          ::std::__cxx11::string::~string((string *)local_1b78);
          ::std::__cxx11::string::~string((string *)(ret_11.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_1b10);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_1950);
      if (local_138 != 0) goto joined_r0x002d2910;
      ::std::__cxx11::string::string((string *)&local_1be0,(string *)ret.err.field_2._8_8_);
      pPVar2 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_1c00,"inputs:dispacement",&local_1c01);
      psVar5 = &local_1c00;
      anon_unknown_0::ParseTypedAttribute<float>
                ((ParseResult *)local_1bc0,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_1be0,pPVar2,psVar5,&surface->displacement);
      ::std::__cxx11::string::~string((string *)&local_1c00);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1c01);
      ::std::__cxx11::string::~string((string *)&local_1be0);
      if ((local_1bc0._0_4_ == Success) || (local_1bc0._0_4_ == AlreadyProcessed)) {
        local_138 = 3;
      }
      else if (local_1bc0._0_4_ == Unmatched) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1d80);
        poVar4 = ::std::operator<<((ostream *)local_1d80,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructShader");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xfae);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1dc0,"Parsing attribute `{}` failed. Error: {}",&local_1dc1);
        fmt::format<char[19],std::__cxx11::string>
                  (&local_1da0,(fmt *)local_1dc0,(string *)"inputs:dispacement",
                   (char (*) [19])&ret_11,psVar5);
        poVar4 = ::std::operator<<((ostream *)local_1d80,(string *)&local_1da0);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)&local_1da0);
        ::std::__cxx11::string::~string(local_1dc0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1dc1);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_1de8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_12.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_1de8);
          ::std::__cxx11::string::~string((string *)local_1de8);
          ::std::__cxx11::string::~string((string *)(ret_12.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_1d80);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_1bc0);
      if (local_138 != 0) goto joined_r0x002d2910;
      ::std::__cxx11::string::string((string *)&local_1e50,(string *)ret.err.field_2._8_8_);
      pPVar2 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_1e70,"inputs:occlusion",&local_1e71);
      psVar5 = &local_1e70;
      anon_unknown_0::ParseTypedAttribute<float>
                ((ParseResult *)local_1e30,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_1e50,pPVar2,psVar5,&surface->occlusion);
      ::std::__cxx11::string::~string((string *)&local_1e70);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1e71);
      ::std::__cxx11::string::~string((string *)&local_1e50);
      if ((local_1e30._0_4_ == Success) || (local_1e30._0_4_ == AlreadyProcessed)) {
        local_138 = 3;
      }
      else if (local_1e30._0_4_ == Unmatched) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_1ff0);
        poVar4 = ::std::operator<<((ostream *)local_1ff0,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructShader");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xfb0);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_2030,"Parsing attribute `{}` failed. Error: {}",&local_2031);
        fmt::format<char[17],std::__cxx11::string>
                  (&local_2010,(fmt *)local_2030,(string *)"inputs:occlusion",(char (*) [17])&ret_12
                   ,psVar5);
        poVar4 = ::std::operator<<((ostream *)local_1ff0,(string *)&local_2010);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)&local_2010);
        ::std::__cxx11::string::~string(local_2030);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2031);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_2058,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_13.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_2058);
          ::std::__cxx11::string::~string((string *)local_2058);
          ::std::__cxx11::string::~string((string *)(ret_13.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_1ff0);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_1e30);
      if (local_138 != 0) goto joined_r0x002d2910;
      ::std::__cxx11::string::string((string *)&local_20c0,(string *)ret.err.field_2._8_8_);
      pPVar2 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_20e0,"inputs:useSpecularWorkflow",&local_20e1)
      ;
      psVar5 = &local_20e0;
      anon_unknown_0::ParseTypedAttribute<int>
                ((ParseResult *)local_20a0,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_20c0,pPVar2,psVar5,&surface->useSpecularWorkflow);
      ::std::__cxx11::string::~string((string *)&local_20e0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_20e1);
      ::std::__cxx11::string::~string((string *)&local_20c0);
      if ((local_20a0._0_4_ == Success) || (local_20a0._0_4_ == AlreadyProcessed)) {
        local_138 = 3;
      }
      else if (local_20a0._0_4_ == Unmatched) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_2260);
        poVar4 = ::std::operator<<((ostream *)local_2260,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructShader");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xfb2);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_22a0,"Parsing attribute `{}` failed. Error: {}",&local_22a1);
        fmt::format<char[27],std::__cxx11::string>
                  (&local_2280,(fmt *)local_22a0,(string *)"inputs:useSpecularWorkflow",
                   (char (*) [27])&ret_13,psVar5);
        poVar4 = ::std::operator<<((ostream *)local_2260,(string *)&local_2280);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)&local_2280);
        ::std::__cxx11::string::~string(local_22a0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_22a1);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_22c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_14.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_22c8);
          ::std::__cxx11::string::~string((string *)local_22c8);
          ::std::__cxx11::string::~string((string *)(ret_14.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_2260);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_20a0);
      if (local_138 != 0) goto joined_r0x002d2910;
      ::std::__cxx11::string::string((string *)&local_2330,(string *)ret.err.field_2._8_8_);
      pPVar2 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_2350,"outputs:surface",&local_2351);
      psVar5 = &local_2350;
      anon_unknown_0::ParseShaderOutputTerminalAttribute<tinyusdz::Token>
                ((ParseResult *)local_2310,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_2330,pPVar2,psVar5,&surface->outputsSurface);
      ::std::__cxx11::string::~string((string *)&local_2350);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_2351);
      ::std::__cxx11::string::~string((string *)&local_2330);
      if ((local_2310._0_4_ == Success) || (local_2310._0_4_ == AlreadyProcessed)) {
        local_138 = 3;
      }
      else if (local_2310._0_4_ == Unmatched) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_24d0);
        poVar4 = ::std::operator<<((ostream *)local_24d0,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructShader");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xfb4);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_2510,"Parsing shader output property `{}` failed. Error: {}",&local_2511);
        fmt::format<char[16],std::__cxx11::string>
                  (&local_24f0,(fmt *)local_2510,(string *)"outputs:surface",(char (*) [16])&ret_14,
                   psVar5);
        poVar4 = ::std::operator<<((ostream *)local_24d0,(string *)&local_24f0);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)&local_24f0);
        ::std::__cxx11::string::~string(local_2510);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2511);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_2538,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (ret_15.err.field_2._M_local_buf + 8));
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_2538);
          ::std::__cxx11::string::~string((string *)local_2538);
          ::std::__cxx11::string::~string((string *)(ret_15.err.field_2._M_local_buf + 8));
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_24d0);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_2310);
      if (local_138 != 0) goto joined_r0x002d2910;
      ::std::__cxx11::string::string((string *)&local_25a0,(string *)ret.err.field_2._8_8_);
      pPVar2 = (Property *)(ret.err.field_2._8_8_ + 0x20);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_25c0,"outputs:displacement",&local_25c1);
      psVar5 = &local_25c0;
      anon_unknown_0::ParseShaderOutputTerminalAttribute<tinyusdz::Token>
                ((ParseResult *)local_2580,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,&local_25a0,pPVar2,psVar5,&surface->outputsDisplacement);
      ::std::__cxx11::string::~string((string *)&local_25c0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_25c1);
      ::std::__cxx11::string::~string((string *)&local_25a0);
      if ((local_2580._0_4_ == Success) || (local_2580._0_4_ == AlreadyProcessed)) {
        local_138 = 3;
      }
      else if (local_2580._0_4_ == Unmatched) {
        local_138 = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_2740);
        poVar4 = ::std::operator<<((ostream *)local_2740,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructShader");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xfb6);
        ::std::operator<<(poVar4," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_2780,"Parsing shader output property `{}` failed. Error: {}",&local_2781);
        fmt::format<char[21],std::__cxx11::string>
                  (&local_2760,(fmt *)local_2780,(string *)"outputs:displacement",
                   (char (*) [21])&ret_15,psVar5);
        poVar4 = ::std::operator<<((ostream *)local_2740,(string *)&local_2760);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string((string *)&local_2760);
        ::std::__cxx11::string::~string(local_2780);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2781);
        if (table._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_27a8,local_27c8);
          ::std::__cxx11::string::operator=
                    ((string *)table._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (string *)local_27a8);
          ::std::__cxx11::string::~string((string *)local_27a8);
          ::std::__cxx11::string::~string((string *)local_27c8);
        }
        spec_local._7_1_ = 0;
        local_138 = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_2740);
      }
      anon_unknown_0::ParseResult::~ParseResult((ParseResult *)local_2580);
      if (local_138 != 0) goto joined_r0x002d2910;
      sVar3 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_70,(key_type *)ret.err.field_2._8_8_);
      if (sVar3 == 0) {
        pPVar2 = (Property *)(ret.err.field_2._8_8_ + 0x20);
        this = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::operator[](&(surface->super_ShaderNode).super_UsdShadePrim.props,
                            (key_type *)ret.err.field_2._8_8_);
        Property::operator=(this,pPVar2);
        ::std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,(value_type *)ret.err.field_2._8_8_);
      }
      sVar3 = ::std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_70,(key_type *)ret.err.field_2._8_8_);
      if (sVar3 == 0) {
        ::std::__cxx11::ostringstream::ostringstream(local_2950);
        poVar4 = ::std::operator<<((ostream *)local_2950,"[warn]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"ReconstructShader");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0xfb8);
        ::std::operator<<(poVar4," ");
        ::std::operator+((char *)local_2970,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "Unsupported/unimplemented property: ");
        poVar4 = ::std::operator<<((ostream *)local_2950,local_2970);
        ::std::operator<<(poVar4,"\n");
        ::std::__cxx11::string::~string(local_2970);
        if (warn != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::operator+(local_2990,local_29b0);
          ::std::__cxx11::string::operator=((string *)warn,(string *)local_2990);
          ::std::__cxx11::string::~string((string *)local_2990);
          ::std::__cxx11::string::~string((string *)local_29b0);
        }
        ::std::__cxx11::ostringstream::~ostringstream(local_2950);
      }
    }
    else {
joined_r0x002d2910:
      if (local_138 != 3) goto LAB_002d2aeb;
    }
    ::std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>
    ::operator++(&__end2);
  }
  spec_local._7_1_ = 1;
LAB_002d2aeb:
  ::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_70);
  return (bool)(spec_local._7_1_ & 1);
}

Assistant:

bool ReconstructShader<UsdPreviewSurface>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPreviewSurface *surface,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {
  (void)spec;
  (void)references;
  (void)options;

  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:diffuseColor", UsdPreviewSurface,
                         surface->diffuseColor)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:emissiveColor", UsdPreviewSurface,
                         surface->emissiveColor)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:roughness", UsdPreviewSurface,
                         surface->roughness)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:specularColor", UsdPreviewSurface,
                         surface->specularColor)  // specular workflow
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:metallic", UsdPreviewSurface,
                         surface->metallic)  // non specular workflow
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:clearcoat", UsdPreviewSurface,
                         surface->clearcoat)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:clearcoatRoughness",
                         UsdPreviewSurface, surface->clearcoatRoughness)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:opacity", UsdPreviewSurface,
                         surface->opacity)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:opacityThreshold",
                         UsdPreviewSurface, surface->opacityThreshold)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:ior", UsdPreviewSurface,
                         surface->ior)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:normal", UsdPreviewSurface,
                         surface->normal)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:dispacement", UsdPreviewSurface,
                         surface->displacement)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:occlusion", UsdPreviewSurface,
                         surface->occlusion)
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:useSpecularWorkflow",
                         UsdPreviewSurface, surface->useSpecularWorkflow)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:surface", UsdPreviewSurface,
                   surface->outputsSurface)
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:displacement", UsdPreviewSurface,
                   surface->outputsDisplacement)
    ADD_PROPERTY(table, prop, UsdPreviewSurface, surface->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }

  return true;
}